

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int script_status(uint script_id,uint32_t *param)

{
  uint32_t sent;
  uint32_t p [11];
  
  sent = pigpio_command(gPigCommand,0x2d,script_id,0,0);
  if (0 < (int)sent) {
    recvMax(p,0x2c,sent);
    sent = p[0];
    if (param != (uint32_t *)0x0) {
      *(undefined8 *)(param + 8) = p._36_8_;
      *(undefined8 *)(param + 4) = p._20_8_;
      *(undefined8 *)(param + 6) = p._28_8_;
      *(undefined8 *)param = p._4_8_;
      *(undefined8 *)(param + 2) = p._12_8_;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int script_status(unsigned script_id, uint32_t *param)
{
   int status;
   uint32_t p[PI_MAX_SCRIPT_PARAMS+1]; /* space for script status */

   status = pigpio_command(gPigCommand, PI_CMD_PROCP, script_id, 0, 0);

   if (status > 0)
   {
      recvMax(p, sizeof(p), status);
      status = p[0];
      if (param) memcpy(param, p+1, sizeof(p)-4);
   }

   pthread_mutex_unlock(&command_mutex);

   return status;
}